

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzerResults.cpp
# Opt level: O1

void __thiscall
LINAnalyzerResults::GenerateBubbleText
          (LINAnalyzerResults *this,U64 frame_index,Channel *channel,DisplayBase display_base)

{
  bool bVar1;
  long lVar2;
  char **ppcVar3;
  string str [3];
  Frame frame;
  string fault_str;
  char number_str [128];
  char seq_str [128];
  undefined8 local_1e8 [2];
  char *local_1d8 [2];
  undefined1 local_1c8 [16];
  char *local_1b8;
  char *local_1b0;
  char *local_198 [2];
  undefined1 local_188 [24];
  Frame local_170 [16];
  ulonglong local_160;
  long local_158;
  char local_150;
  byte local_14f;
  char *local_148;
  long local_140;
  char local_138 [16];
  char local_128 [128];
  char local_a8 [128];
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)local_170);
  local_140 = 0;
  local_138[0] = '\0';
  lVar2 = 0x10;
  do {
    *(undefined1 **)((long)local_1e8 + lVar2) = (undefined1 *)((long)local_1d8 + lVar2);
    *(undefined8 *)((long)local_1e8 + lVar2 + 8) = 0;
    *(undefined1 *)((long)local_1d8 + lVar2) = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x70);
  local_148 = local_138;
  if ((local_14f & 1) != 0) {
    std::__cxx11::string::append((char *)&local_148);
  }
  if ((local_14f & 2) != 0) {
    std::__cxx11::string::append((char *)&local_148);
  }
  if ((local_14f & 4) != 0) {
    std::__cxx11::string::append((char *)&local_148);
  }
  if ((local_14f & 8) != 0) {
    std::__cxx11::string::append((char *)&local_148);
  }
  if (local_140 != 0) {
    std::__cxx11::string::append((char *)&local_148);
    local_1e8[0] = 0;
    AnalyzerResults::AddResultString
              ((char *)this,local_148,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    if ((local_150 != '\x06') || (local_14f != 8)) goto LAB_001088b3;
    AnalyzerHelpers::GetNumberString(local_160,display_base,8,local_128,0x80);
    std::__cxx11::string::_M_replace((ulong)local_1d8,0,local_1d8[1],0x10a1e0);
    std::__cxx11::string::append((char *)local_1d8);
    ppcVar3 = &local_1b8;
    std::__cxx11::string::_M_replace((ulong)ppcVar3,0,local_1b0,0x10a1eb);
    std::__cxx11::string::append((char *)ppcVar3);
    local_1e8[0] = 0;
    AnalyzerResults::AddResultString
              ((char *)this,local_1d8[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    goto LAB_00108896;
  }
  AnalyzerHelpers::GetNumberString(local_160,display_base,8,local_128,0x80);
  switch(local_150) {
  case '\x01':
    std::__cxx11::string::append((char *)local_1d8);
    std::__cxx11::string::append((char *)&local_1b8);
    break;
  case '\x02':
    std::__cxx11::string::append((char *)local_1d8);
    std::__cxx11::string::append((char *)&local_1b8);
    break;
  case '\x03':
    AnalyzerHelpers::GetNumberString((ulong)((uint)local_160 & 0x3f),display_base,8,local_128,0x80);
    std::__cxx11::string::append((char *)local_1d8);
    std::__cxx11::string::append((char *)&local_1b8);
    std::__cxx11::string::append((char *)&local_1b8);
    std::__cxx11::string::append((char *)local_198);
    break;
  case '\x04':
  case '\x05':
    AnalyzerHelpers::GetNumberString(local_158 - 1,Decimal,8,local_a8,0x80);
    std::__cxx11::string::append((char *)local_1d8);
    std::__cxx11::string::append((char *)&local_1b8);
    std::__cxx11::string::append((char *)&local_1b8);
    std::__cxx11::string::append((char *)&local_1b8);
    std::__cxx11::string::append((char *)&local_1b8);
    std::__cxx11::string::append((char *)local_198);
    std::__cxx11::string::append((char *)local_198);
    std::__cxx11::string::append((char *)local_198);
    std::__cxx11::string::append((char *)local_198);
    goto LAB_00108853;
  case '\x06':
    std::__cxx11::string::append((char *)local_1d8);
    std::__cxx11::string::append((char *)&local_1b8);
    std::__cxx11::string::append((char *)&local_1b8);
    std::__cxx11::string::append((char *)local_198);
    break;
  case '\a':
    bVar1 = IsFrameChecksum(this,frame_index);
    if (bVar1) {
      std::__cxx11::string::append((char *)local_1d8);
      std::__cxx11::string::append((char *)&local_1b8);
      std::__cxx11::string::append((char *)&local_1b8);
      std::__cxx11::string::append((char *)local_198);
      break;
    }
    AnalyzerHelpers::GetNumberString(local_158 - 1,Decimal,8,local_a8,0x80);
    std::__cxx11::string::append((char *)local_1d8);
    std::__cxx11::string::append((char *)&local_1b8);
    std::__cxx11::string::append((char *)&local_1b8);
    std::__cxx11::string::append((char *)&local_1b8);
    std::__cxx11::string::append((char *)&local_1b8);
    std::__cxx11::string::append((char *)local_198);
    std::__cxx11::string::append((char *)local_198);
    std::__cxx11::string::append((char *)local_198);
    std::__cxx11::string::append((char *)local_198);
    goto LAB_00108853;
  default:
    std::__cxx11::string::append((char *)local_1d8);
    std::__cxx11::string::append((char *)&local_1b8);
  }
  std::__cxx11::string::append((char *)local_198);
LAB_00108853:
  local_1e8[0] = 0;
  AnalyzerResults::AddResultString
            ((char *)this,local_1d8[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  local_1e8[0] = 0;
  AnalyzerResults::AddResultString
            ((char *)this,local_1b8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  ppcVar3 = local_198;
LAB_00108896:
  local_1e8[0] = 0;
  AnalyzerResults::AddResultString
            ((char *)this,*ppcVar3,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_001088b3:
  lVar2 = 0;
  do {
    if (local_188 + lVar2 != *(undefined1 **)((long)local_198 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_198 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x60);
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  Frame::~Frame(local_170);
  return;
}

Assistant:

void LINAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& channel, DisplayBase display_base )
{
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    char number_str[ 128 ];
    std::string fault_str;
    std::string str[ 3 ];

    if( frame.mFlags & byteFramingError )
        fault_str += "!FRAME";
    if( frame.mFlags & headerBreakExpected )
        fault_str += "!BREAK";
    if( frame.mFlags & headerSyncExpected )
        fault_str += "!SYNC";
    if( frame.mFlags & checksumMismatch )
        fault_str += "!CHK";
    if( fault_str.length() )
    {
        fault_str += "!";
        AddResultString( fault_str.c_str() );

        // display the error checksum if and only if the frame was a checksum and the only error was a checksum mismatch.
        if( ( frame.mType == ( U8 )LINAnalyzerResults::responseChecksum ) && ( frame.mFlags == checksumMismatch ) )
        {
            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );
            str[ 0 ] = "!CHK ERR: ";
            str[ 0 ] += number_str;
            str[ 1 ] = "!Checksum mismatch: ";
            str[ 1 ] += number_str;
            AddResultString( str[ 0 ].c_str() );
            AddResultString( str[ 1 ].c_str() );
        }
    }
    else
    {
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

        switch( ( LINAnalyzerResults::tLINFrameState )frame.mType )
        {
        default:
        case LINAnalyzerResults::NoFrame:
            str[ 0 ] += "IBS";
            str[ 1 ] += "IB Space";
            str[ 2 ] += "Inter-Byte Space";
            // AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, str, 128 );
            break;
        case LINAnalyzerResults::headerBreak: // expecting break.
            str[ 0 ] += "BRK";
            str[ 1 ] += "Break";
            str[ 2 ] += "Header Break";
            break;
        case LINAnalyzerResults::headerSync: // expecting sync.
            str[ 0 ] += "SYN";
            str[ 1 ] += "Sync";
            str[ 2 ] += "Header Sync";
            break;
        case LINAnalyzerResults::headerPID: // expecting PID.
            AnalyzerHelpers::GetNumberString( frame.mData1 & 0x3F, display_base, 8, number_str, 128 );
            str[ 0 ] += number_str;

            str[ 1 ] += "PID: ";
            str[ 1 ] += number_str;

            str[ 2 ] += "Protected ID: ";
            str[ 2 ] += number_str;
            break;
        // LIN Response
        case LINAnalyzerResults::responseDataZero: // expecting first resppnse data byte.
        case LINAnalyzerResults::responseData:     // expecting response data.
        {
            char seq_str[ 128 ];
            AnalyzerHelpers::GetNumberString( frame.mData2 - 1, Decimal, 8, seq_str, 128 );
            str[ 0 ] += number_str;
            str[ 1 ] += "D";
            str[ 1 ] += seq_str;
            str[ 1 ] += ": ";
            str[ 1 ] += number_str;
            str[ 2 ] += "Data ";
            str[ 2 ] += seq_str;
            str[ 2 ] += ": ";
            str[ 2 ] += number_str;
        }
        break;
        case LINAnalyzerResults::responseChecksum: // expecting checksum.
            str[ 0 ] += number_str;
            str[ 1 ] += "CHK: ";
            str[ 1 ] += number_str;
            str[ 2 ] += "Checksum: ";
            str[ 2 ] += number_str;
            break;

        case LINAnalyzerResults::responsePotentialChecksum:
            if( IsFrameChecksum( frame_index ) )
            {
                str[ 0 ] += number_str;
                str[ 1 ] += "CHK: ";
                str[ 1 ] += number_str;
                str[ 2 ] += "Checksum: ";
                str[ 2 ] += number_str;
            }
            else
            {
                char seq_str[ 128 ];
                AnalyzerHelpers::GetNumberString( frame.mData2 - 1, Decimal, 8, seq_str, 128 );
                str[ 0 ] += number_str;
                str[ 1 ] += "D";
                str[ 1 ] += seq_str;
                str[ 1 ] += ": ";
                str[ 1 ] += number_str;
                str[ 2 ] += "Data ";
                str[ 2 ] += seq_str;
                str[ 2 ] += ": ";
                str[ 2 ] += number_str;
            }

            break;
        }

        AddResultString( str[ 0 ].c_str() );
        AddResultString( str[ 1 ].c_str() );
        AddResultString( str[ 2 ].c_str() );
    }
}